

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.c
# Opt level: O0

void GameDraw(void)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  double dVar8;
  ALLEGRO_FONT *pAVar9;
  int iVar14;
  double dVar10;
  int d;
  double index;
  double u;
  double y1;
  double lowy;
  double y2;
  int c;
  float w;
  int chh;
  int chw;
  ALLEGRO_TRANSFORM transform;
  ALLEGRO_VERTEX Points [4];
  double depth;
  ALLEGRO_BITMAP *ch;
  double *in_stack_fffffffffffffe48;
  int *lev;
  double in_stack_fffffffffffffe60;
  undefined1 *puVar11;
  undefined4 in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe6c;
  double in_stack_fffffffffffffe70;
  void *pvVar12;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  ALLEGRO_VERTEX *in_stack_fffffffffffffe80;
  int *piVar13;
  double local_108;
  int local_f8;
  undefined1 local_e8 [64];
  undefined1 local_a8 [152];
  double local_10;
  ALLEGRO_BITMAP *local_8;
  
  al_identity_transform(local_e8);
  al_scale_transform(CONCAT44((int)((ulong)((double)screen_height / 480.0) >> 0x20),
                              (float)((double)screen_height / 480.0)),
                     CONCAT44((int)((ulong)((double)screen_height / 480.0) >> 0x20),
                              (float)((double)screen_height / 480.0)),local_e8);
  al_use_transform(local_e8);
  fVar2 = (float)screen_width;
  fVar1 = (float)screen_height;
  local_108 = 480.0;
  for (local_f8 = 0x77f; 0x3cf < local_f8; local_f8 = local_f8 + -1) {
    uVar3 = al_fixmul(TanTable[local_f8]);
    local_10 = (double)al_fixtof(uVar3);
    if ((-261.0 < local_10) && (local_10 < -5.0)) {
      dVar8 = sin((((double)((int)(local_10 * 65536.0) & 0xffffff) / 65536.0 - 1.0) *
                   3.141592653589793 * 2.0 * 8.0) / 128.0 + WaveY);
      dVar8 = (double)local_f8 / 4.0 - (dVar8 * 125.0) / local_10;
      if (dVar8 < local_108) {
        local_108 = ceil(dVar8);
        set_v(in_stack_fffffffffffffe80,
              (double)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
              in_stack_fffffffffffffe70,
              (double)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
              in_stack_fffffffffffffe60);
        set_v(in_stack_fffffffffffffe80,
              (double)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
              in_stack_fffffffffffffe70,
              (double)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
              in_stack_fffffffffffffe60);
        set_v(in_stack_fffffffffffffe80,
              (double)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
              in_stack_fffffffffffffe70,
              (double)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
              in_stack_fffffffffffffe60);
        set_v(in_stack_fffffffffffffe80,
              (double)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
              in_stack_fffffffffffffe70,
              (double)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
              in_stack_fffffffffffffe60);
        al_draw_prim(local_a8,0,water,0,4,5);
      }
    }
  }
  piVar13 = &screen_width;
  lev = &screen_height;
  al_set_clipping_rectangle
            (0,0,screen_width,(int)((local_108 * (double)screen_height) / 480.0 + 1.0));
  al_clear_to_color(cloud_color._0_8_,cloud_color._8_8_);
  DrawClouds();
  al_set_clipping_rectangle(0,0,*piVar13,*(int *)(((Level *)lev)->DisplayTree).Bounder.TL.Pos);
  DrawLevelBackground((Level *)lev,in_stack_fffffffffffffe48);
  local_8 = GetCurrentBitmap((Animation *)0x10b5a0);
  iVar4 = al_get_bitmap_width(local_8);
  iVar5 = al_get_bitmap_height(local_8);
  _iVar14 = CONCAT44((int)((ulong)((double)iVar5 * 0.5) >> 0x20),(float)((double)iVar5 * 0.5));
  dVar8 = (PlayerPos[0] - ScrollPos[0]) + (double)(((fVar2 * 480.0) / fVar1) * 0.5);
  dVar10 = (PlayerPos[1] - ScrollPos[1]) + 240.0;
  al_draw_scaled_rotated_bitmap
            (CONCAT44((int)((ulong)((double)iVar4 * 0.5) >> 0x20),(float)((double)iVar4 * 0.5)),
             (undefined8)_iVar14,CONCAT44((int)((ulong)dVar8 >> 0x20),(float)dVar8),
             CONCAT44((int)((ulong)dVar10 >> 0x20),(float)dVar10),0x3f800000,0x3f800000,
             (float)PlayerPos[2],local_8,(KeyFlags & 0x20U) >> 5);
  DrawLevelForeground((Level *)0x10b68f);
  puVar11 = local_e8;
  al_identity_transform();
  al_use_transform(puVar11);
  pvVar12 = demo_data[1].dat;
  iVar4 = *piVar13;
  iVar5 = al_get_text_width(pvVar12,"Items Required: 1000");
  uVar6 = iVar4 - iVar5;
  pAVar9 = (ALLEGRO_FONT *)al_map_rgb(0xff,0xff);
  demo_textprintf(pAVar9,(int)pvVar12,(int)(ulong)uVar6,8,"Items Required: %d",
                  (ulong)(uint)RequiredObjectsLeft);
  pvVar12 = demo_data[1].dat;
  iVar4 = *piVar13;
  iVar5 = al_get_text_width(pvVar12,"Items Remaining: 1000");
  iVar7 = al_get_font_line_height(demo_data[1].dat);
  pAVar9 = (ALLEGRO_FONT *)al_map_rgb(0xff,0xff);
  demo_textprintf(pAVar9,_iVar14,(int)pvVar12,(ulong)(uint)(iVar4 - iVar5),
                  (char *)(ulong)(iVar7 + 8),"Items Remaining: %d",(ulong)(uint)TotalObjectsLeft);
  return;
}

Assistant:

static void GameDraw(void)
{
   ALLEGRO_BITMAP *ch;
   double depth;
   ALLEGRO_VERTEX Points[4];
   ALLEGRO_TRANSFORM transform;
   int chw, chh;
   float w;
   
   al_identity_transform(&transform);
   al_scale_transform(&transform, screen_height / 480.0, screen_height / 480.0);
   al_use_transform(&transform);

   w = screen_width * 480.0 / screen_height;

   /* draw background */
   {
      int c = 480 * 4 - 1;
      double y2, lowy = 480, y1, u;
      double index;

      while (c > 480 * 2 + 15) {

         depth = al_fixtof(al_fixmul(TanTable[c], (int)((ScrollPos[1] - 240) * 4096.0f)));

         if (depth > -261 && depth < -5.0f) {
            int d = ((int)(depth * 65536)) & (256 * 65536 - 1);
            y1 = lowy;
            index = (d / 65536.0 - 1.0) * ALLEGRO_PI * 2 * 8 / 128.0f;

            y2 = c / 4.0 - 125.0f * sin(index + WaveY) / depth;

            if (y2 < lowy) {
               lowy = ceil(y2);

               u = 64 + ScrollPos[0] / 8 + TexX;
               set_v(Points + 0, 0, y2, u + depth * 4, depth + 5);
               set_v(Points + 1, w, y2, u - depth * 4, depth + 5);
               set_v(Points + 2, w, y1, u - depth * 4, depth + 5);
               set_v(Points + 3, 0, y1, u + depth * 4, depth + 5);

               al_draw_prim(Points, NULL, water, 0, 4, ALLEGRO_PRIM_TRIANGLE_FAN);
            }
         }
         c--;
      }

      al_set_clipping_rectangle(0, 0, screen_width, lowy * screen_height / 480 + 1);
      al_clear_to_color(cloud_color);
      DrawClouds();
      al_set_clipping_rectangle(0, 0, screen_width, screen_height);
   }

   /* draw interactable parts of level */
   DrawLevelBackground(Lvl, ScrollPos);

#ifdef DEBUG_EDGES
   solid_mode();
   struct Edge *E = Lvl->AllEdges;

   while (E) {
      line(buffer,
           E->EndPoints[0]->Normal[0] - x + (screen_width >> 1),
           E->EndPoints[0]->Normal[1] - y + (screen_height >> 1),
           E->EndPoints[1]->Normal[0] - x + (screen_width >> 1),
           E->EndPoints[1]->Normal[1] - y + (screen_height >> 1), al_map_rgb(0, 0,
                                                                     0));
      E = E->Next;
   }
#endif

#ifdef DEBUG_OBJECTS
   struct Object *O = Lvl->AllObjects;

   while (O) {
      rect(buffer,
           O->Bounder.TL.Pos[0] - x + (screen_width >> 1),
           O->Bounder.TL.Pos[1] - y + (screen_height >> 1),
           O->Bounder.BR.Pos[0] - x + (screen_width >> 1),
           O->Bounder.BR.Pos[1] - y + (screen_height >> 1), al_map_rgb(0, 0, 0));
      circle(buffer, O->Pos[0] - x + (screen_width >> 1),
             O->Pos[1] - y + (screen_height >> 1), O->ObjType->Radius, al_map_rgb(0,
                                                                          0,
                                                                          0));
      O = O->Next;
   }
#endif

   /* add player sprite */
   ch = GetCurrentBitmap(PlayerAnim);
   chw = al_get_bitmap_width(ch);
   chh = al_get_bitmap_height(ch);

   al_draw_scaled_rotated_bitmap(ch, chw / 2.0, chh / 2.0,
      (PlayerPos[0] - ScrollPos[0]) + w / 2,
      (PlayerPos[1] - ScrollPos[1]) + 480.0 / 2,
      1, 1, PlayerPos[2],
      KeyFlags & KEYFLAG_FLIP ? ALLEGRO_FLIP_HORIZONTAL : 0);

   DrawLevelForeground(Lvl);
   
   al_identity_transform(&transform);
   al_use_transform(&transform);

   /* add status */
   demo_textprintf(demo_font,
                 screen_width - al_get_text_width(demo_font,
                                        "Items Required: 1000"), 8,
                 al_map_rgb(255, 255, 255), "Items Required: %d",
                 RequiredObjectsLeft);
   demo_textprintf(demo_font,
                 screen_width - al_get_text_width(demo_font,
                                        "Items Remaining: 1000"),
                 8 + al_get_font_line_height(demo_font), al_map_rgb(255, 255, 255),
                 "Items Remaining: %d", TotalObjectsLeft);
}